

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O3

btree_result btree_iterator_init(btree *btree,btree_iterator *it,void *initial_key)

{
  ushort uVar1;
  btree_print_func *pbVar2;
  bid_t bVar3;
  btree_blk_ops *pbVar4;
  bnode_flag_t bVar5;
  undefined6 uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint16_t uVar9;
  uint32_t uVar10;
  void *pvVar11;
  bid_t *pbVar12;
  idx_t *piVar13;
  bnode **ppbVar14;
  void **ppvVar15;
  ulong uVar16;
  ulong uVar17;
  
  (it->btree).aux = btree->aux;
  uVar7 = btree->ksize;
  uVar8 = btree->vsize;
  uVar9 = btree->height;
  uVar10 = btree->blksize;
  bVar3 = btree->root_bid;
  pvVar11 = btree->blk_handle;
  pbVar4 = btree->blk_ops;
  bVar5 = btree->root_flag;
  uVar6 = *(undefined6 *)&btree->field_0x2a;
  (it->btree).kv_ops = btree->kv_ops;
  (it->btree).root_flag = bVar5;
  *(undefined6 *)&(it->btree).field_0x2a = uVar6;
  (it->btree).blk_handle = pvVar11;
  (it->btree).blk_ops = pbVar4;
  (it->btree).ksize = uVar7;
  (it->btree).vsize = uVar8;
  (it->btree).height = uVar9;
  (it->btree).blksize = uVar10;
  (it->btree).root_bid = bVar3;
  pvVar11 = malloc((ulong)btree->ksize);
  it->curkey = pvVar11;
  pbVar2 = btree->kv_ops->init_kv_var;
  if (pbVar2 != (btree_print_func *)0x0) {
    (*pbVar2)(btree,pvVar11,(void *)0x0);
  }
  if (initial_key != (void *)0x0) {
    (*btree->kv_ops->set_key)(btree,it->curkey,initial_key);
  }
  uVar1 = btree->height;
  uVar17 = (ulong)((uint)uVar1 * 8);
  pbVar12 = (bid_t *)malloc(uVar17);
  it->bid = pbVar12;
  piVar13 = (idx_t *)malloc((ulong)((uint)uVar1 * 2));
  it->idx = piVar13;
  ppbVar14 = (bnode **)malloc(uVar17);
  it->node = ppbVar14;
  ppvVar15 = (void **)malloc(uVar17);
  it->addr = ppvVar15;
  if (uVar1 == 0) {
    uVar17 = 0;
  }
  else {
    uVar16 = 0;
    do {
      it->bid[uVar16] = 0xffffffffffffffff;
      it->idx[uVar16] = 0xffff;
      it->node[uVar16] = (bnode *)0x0;
      it->addr[uVar16] = (void *)0x0;
      uVar16 = uVar16 + 1;
      uVar17 = (ulong)btree->height;
    } while (uVar16 < uVar17);
    pbVar12 = it->bid;
  }
  pbVar12[uVar17 - 1] = btree->root_bid;
  it->flags = '\0';
  return BTREE_RESULT_SUCCESS;
}

Assistant:

btree_result btree_iterator_init(struct btree *btree,
                                 struct btree_iterator *it, void *initial_key)
{
    int i;

    it->btree = *btree;
    it->curkey = (void *)mempool_alloc(btree->ksize);
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, it->curkey, NULL);
    }
    if (initial_key) {
        // set initial key if exists
        //memcpy(it->curkey, initial_key, btree->ksize);
        btree->kv_ops->set_key(btree, it->curkey, initial_key);
    }else{
        // NULL initial key .. set minimum key (start from leftmost key)
        // replaced by kv_ops->init_kv_var
        //memset(it->curkey, 0, btree->ksize);
    }
    it->bid = (bid_t*)mempool_alloc(sizeof(bid_t) * btree->height);
    it->idx = (idx_t*)mempool_alloc(sizeof(idx_t) * btree->height);
    it->node = (struct bnode **)mempool_alloc(sizeof(struct bnode *)
                                                              * btree->height);
    it->addr = (void**)mempool_alloc(sizeof(void*) * btree->height);

    for (i=0;i<btree->height;++i){
        it->bid[i] = BTREE_BLK_NOT_FOUND;
        it->idx[i] = BTREE_IDX_NOT_FOUND;
        it->node[i] = NULL;
        it->addr[i] = NULL;
    }
    it->bid[btree->height-1] = btree->root_bid;
    it->flags = 0;

    return BTREE_RESULT_SUCCESS;
}